

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O0

void PacketGet(void)

{
  FStartupScreen *pFVar1;
  ssize_t sVar2;
  int *piVar3;
  char *pcVar4;
  FString local_40;
  int local_34;
  undefined8 uStack_30;
  int err_1;
  uLongf msgsize;
  int err;
  int node;
  sockaddr_in fromaddress;
  socklen_t fromlen;
  int c;
  
  fromaddress.sin_zero[0] = '\x10';
  fromaddress.sin_zero[1] = '\0';
  fromaddress.sin_zero[2] = '\0';
  fromaddress.sin_zero[3] = '\0';
  sVar2 = recvfrom(mysocket,TransmitBuffer,8000,0,(sockaddr *)&err,(socklen_t *)fromaddress.sin_zero
                  );
  fromaddress.sin_zero._4_4_ = SUB84(sVar2,0);
  msgsize._4_4_ = FindNode((sockaddr_in *)&err);
  if ((msgsize._4_4_ < 0) || (fromaddress.sin_zero._4_4_ != -1)) {
    if ((msgsize._4_4_ < 0) || ((int)fromaddress.sin_zero._4_4_ < 1)) {
      if (0 < (int)fromaddress.sin_zero._4_4_) {
        if (((fromaddress.sin_zero._4_4_ != 2) || (TransmitBuffer[0] != '0')) ||
           (TransmitBuffer[1] != '\x02')) {
          pcVar4 = inet_ntoa((in_addr)node);
          DPrintf(2,"Dropped packet: Unknown host (%s:%d)\n",pcVar4,(ulong)err._2_2_);
        }
        doomcom.remotenode = -1;
        return;
      }
    }
    else {
      doomcom.data[0] = TransmitBuffer[0] & 0xfb;
      if ((TransmitBuffer[0] & 4) == 0) {
        memcpy(doomcom.data + 1,TransmitBuffer + 1,(long)(fromaddress.sin_zero._4_4_ + -1));
      }
      else {
        uStack_30 = 13999;
        local_34 = uncompress(0xd54f75,&stack0xffffffffffffffd0,TransmitBuffer + 1,
                              (long)(fromaddress.sin_zero._4_4_ + -1));
        if (local_34 != 0) {
          M_ZLibError((int)&local_40);
          pcVar4 = FString::GetChars(&local_40);
          Printf("Net decompression failed (zlib error %s)\n",pcVar4);
          FString::~FString(&local_40);
          doomcom.remotenode = -1;
          return;
        }
        fromaddress.sin_zero._4_4_ = (int)uStack_30 + 1;
      }
    }
  }
  else {
    piVar3 = __errno_location();
    pFVar1 = StartScreen;
    msgsize._0_4_ = *piVar3;
    if ((int)msgsize == 0x68) {
      if (StartScreen == (FStartupScreen *)0x0) {
        pcVar4 = userinfo_t::GetName((userinfo_t *)
                                     ((ulong)sendplayer[msgsize._4_4_] * 0x2a0 + 0xd63498));
        Printf("The connection from %s was dropped.\n",pcVar4);
      }
      else {
        pcVar4 = userinfo_t::GetName((userinfo_t *)
                                     ((ulong)sendplayer[msgsize._4_4_] * 0x2a0 + 0xd63498));
        (*pFVar1->_vptr_FStartupScreen[7])(pFVar1,"The connection from %s was dropped.\n",pcVar4);
      }
      doomcom.data[0] = 0x80;
      fromaddress.sin_zero[4] = '\x01';
      fromaddress.sin_zero[5] = '\0';
      fromaddress.sin_zero[6] = '\0';
      fromaddress.sin_zero[7] = '\0';
    }
    else {
      if ((int)msgsize == 0xb) {
        doomcom.remotenode = -1;
        return;
      }
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      I_Error("GetPacket: %s",pcVar4);
    }
  }
  doomcom.datalength._0_1_ = fromaddress.sin_zero[4];
  doomcom.datalength._1_1_ = fromaddress.sin_zero[5];
  doomcom.remotenode = msgsize._4_2_;
  return;
}

Assistant:

void PacketGet (void)
{
	int c;
	socklen_t fromlen;
	sockaddr_in fromaddress;
	int node;

	fromlen = sizeof(fromaddress);
	c = recvfrom (mysocket, (char*)TransmitBuffer, TRANSMIT_SIZE, 0,
				  (sockaddr *)&fromaddress, &fromlen);
	node = FindNode (&fromaddress);

	if (node >= 0 && c == SOCKET_ERROR)
	{
		int err = WSAGetLastError();

		if (err == WSAECONNRESET)
		{ // The remote node aborted unexpectedly, so pretend it sent an exit packet

			if (StartScreen != NULL)
			{
				StartScreen->NetMessage ("The connection from %s was dropped.\n",
					players[sendplayer[node]].userinfo.GetName());
			}
			else
			{
				Printf("The connection from %s was dropped.\n",
					players[sendplayer[node]].userinfo.GetName());
			}

			doomcom.data[0] = 0x80;	// NCMD_EXIT
			c = 1;
		}
		else if (err != WSAEWOULDBLOCK)
		{
			I_Error ("GetPacket: %s", neterror ());
		}
		else
		{
			doomcom.remotenode = -1;		// no packet
			return;
		}
	}
	else if (node >= 0 && c > 0)
	{
		doomcom.data[0] = TransmitBuffer[0] & ~NCMD_COMPRESSED;
		if (TransmitBuffer[0] & NCMD_COMPRESSED)
		{
			uLongf msgsize = MAX_MSGLEN - 1;
			int err = uncompress(doomcom.data + 1, &msgsize, TransmitBuffer + 1, c - 1);
//			Printf("recv %d/%lu\n", c, msgsize + 1);
			if (err != Z_OK)
			{
				Printf("Net decompression failed (zlib error %s)\n", M_ZLibError(err).GetChars());
				// Pretend no packet
				doomcom.remotenode = -1;
				return;
			}
			c = msgsize + 1;
		}
		else
		{
//			Printf("recv %d\n", c);
			memcpy(doomcom.data + 1, TransmitBuffer + 1, c - 1);
		}
	}
	else if (c > 0)
	{	//The packet is not from any in-game node, so we might as well discard it.
		// Don't show the message for disconnect notifications.
		if (c != 2 || TransmitBuffer[0] != PRE_FAKE || TransmitBuffer[1] != PRE_DISCONNECT)
		{
			DPrintf(DMSG_WARNING, "Dropped packet: Unknown host (%s:%d)\n", inet_ntoa(fromaddress.sin_addr), fromaddress.sin_port);
		}
		doomcom.remotenode = -1;
		return;
	}

	doomcom.remotenode = node;
	doomcom.datalength = (short)c;
}